

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O2

TRIPLERGB ** YCbCr2RGB(TRIPLERGB **mrxY,TRIPLERGB **mrxCb,TRIPLERGB **mrxCr,int h,int w)

{
  byte bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  TRIPLERGB **ppTVar5;
  ulong uVar6;
  TRIPLERGB *pTVar7;
  size_t i;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  uVar6 = (long)h * 8;
  if (h < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  ppTVar5 = (TRIPLERGB **)operator_new__(uVar6);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)w;
  uVar6 = SUB168(auVar2 * ZEXT816(3),0);
  if (SUB168(auVar2 * ZEXT816(3),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  for (lVar8 = 0; lVar8 != h; lVar8 = lVar8 + 1) {
    pTVar7 = (TRIPLERGB *)operator_new__(uVar6);
    ppTVar5[lVar8] = pTVar7;
    lVar10 = 2;
    uVar11 = (long)w;
    while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
      dVar15 = (double)(&mrxY[lVar8]->blue)[lVar10];
      dVar13 = (double)(int)((&mrxCr[lVar8]->blue)[lVar10] - 0x80);
      bVar1 = (&mrxCb[lVar8]->blue)[lVar10];
      dVar14 = round(dVar13 * 1.402 + dVar15);
      dVar16 = (double)(int)(bVar1 - 0x80);
      dVar13 = round(dVar16 * -0.334 + dVar13 * -0.714 + dVar15);
      iVar9 = (int)dVar13;
      dVar13 = round(dVar16 * 1.772 + dVar15);
      iVar4 = (int)dVar13;
      iVar3 = (int)dVar14;
      if ((int)dVar14 < 1) {
        iVar3 = 0;
      }
      if (0xfe < iVar3) {
        iVar3 = 0xff;
      }
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      (&pTVar7->blue)[lVar10] = (uchar)iVar3;
      *(char *)((long)pTVar7 + lVar10 + -1) = (char)iVar9;
      *(char *)((long)pTVar7 + lVar10 + -2) = (char)iVar4;
      lVar10 = lVar10 + 3;
    }
  }
  return ppTVar5;
}

Assistant:

TRIPLERGB **YCbCr2RGB(TRIPLERGB **mrxY, TRIPLERGB **mrxCb, TRIPLERGB **mrxCr, int h, int w) {
    TRIPLERGB **mrxRGBrec = new TRIPLERGB *[h];
    for (size_t i = 0; i < h; i++) {
        mrxRGBrec[i] = new TRIPLERGB[w];
        for (size_t j = 0; j < w; j++) {
            u_char Y = mrxY[i][j].red;
            u_char Cb = mrxCb[i][j].red;
            u_char Cr = mrxCr[i][j].red;
            int R = (int) round(Y + 1.402 * (Cr - 128));
            int G = (int) round(Y - 0.714 * (Cr - 128) - 0.334 * (Cb - 128));
            int B = (int) round(Y + 1.772 * (Cb - 128));
            R = (R > 255) ? 255 : ((R < 0) ? 0 : R);
            G = (G > 255) ? 255 : ((G < 0) ? 0 : G);
            B = (B > 255) ? 255 : ((B < 0) ? 0 : B);
            mrxRGBrec[i][j].red = (u_char) R;
            mrxRGBrec[i][j].green = (u_char) G;
            mrxRGBrec[i][j].blue = (u_char) B;
        }
    }
    return mrxRGBrec;
}